

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  int mn;
  int iVar3;
  int local_60;
  int iStack_5c;
  bool is_nav_request;
  int end;
  int start;
  ImVec2 pos;
  undefined1 local_40 [8];
  ImRect rect;
  ImGuiWindow *window;
  ImGuiContext *g;
  int *out_items_display_end_local;
  int *out_items_display_start_local;
  float items_height_local;
  int items_count_local;
  
  pIVar1 = GImGui;
  rect.Max = (ImVec2)GImGui->CurrentWindow;
  if ((GImGui->LogEnabled & 1U) == 0) {
    bVar2 = GetSkipItemForListClipping();
    if (bVar2) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
    }
    else {
      local_40 = *(undefined1 (*) [8])((long)rect.Max + 0x210);
      rect.Min = *(ImVec2 *)((long)rect.Max + 0x218);
      if ((pIVar1->NavMoveScoringItems & 1U) != 0) {
        ImRect::Add((ImRect *)local_40,&pIVar1->NavScoringNoClipRect);
      }
      if ((pIVar1->NavJustMovedToId != 0) &&
         (*(ImGuiID *)((long)rect.Max + 0x378) == pIVar1->NavJustMovedToId)) {
        _pos = WindowRectRelToAbs((ImGuiWindow *)rect.Max,(ImRect *)((long)rect.Max + 0x380));
        ImRect::Add((ImRect *)local_40,(ImRect *)&pos);
      }
      start = (int)((ulong)*(undefined8 *)((long)rect.Max + 0xd8) >> 0x20);
      iStack_5c = (int)(((float)local_40._4_4_ - (float)start) / items_height);
      local_60 = (int)((rect.Min.y - (float)start) / items_height);
      bVar2 = false;
      if (((pIVar1->NavMoveScoringItems & 1U) != 0) &&
         (bVar2 = false, pIVar1->NavWindow != (ImGuiWindow *)0x0)) {
        bVar2 = pIVar1->NavWindow->RootWindowForNav == *(ImGuiWindow **)((long)rect.Max + 0x368);
      }
      if ((bVar2) && (pIVar1->NavMoveClipDir == 2)) {
        iStack_5c = iStack_5c + -1;
      }
      if ((bVar2) && (pIVar1->NavMoveClipDir == 3)) {
        local_60 = local_60 + 1;
      }
      mn = ImClamp<int>(iStack_5c,0,items_count);
      iVar3 = ImClamp<int>(local_60 + 1,mn,items_count);
      *out_items_display_start = mn;
      *out_items_display_end = iVar3;
    }
  }
  else {
    *out_items_display_start = 0;
    *out_items_display_end = items_count;
  }
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the scoring rect which at worst should be 1 page away from ClipRect
    // We don't include g.NavId's rectangle in there (unless g.NavJustMovedToId is set) because the rectangle enlargement can get costly.
    ImRect rect = window->ClipRect;
    if (g.NavMoveScoringItems)
        rect.Add(g.NavScoringNoClipRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        rect.Add(WindowRectRelToAbs(window, window->NavRectRel[0])); // Could store and use NavJustMovedToRectRel

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((rect.Min.y - pos.y) / items_height);
    int end = (int)((rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    // FIXME: Verify this works with tabbing
    const bool is_nav_request = (g.NavMoveScoringItems && g.NavWindow && g.NavWindow->RootWindowForNav == window->RootWindowForNav);
    if (is_nav_request && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (is_nav_request && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}